

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

bool icu_63::numparse::impl::AffixMatcherWarehouse::isInteresting
               (AffixPatternProvider *patternInfo,IgnorablesMatcher *ignorables,
               parse_flags_t parseFlags,UErrorCode *status)

{
  bool bVar1;
  uint uVar2;
  UnicodeSet *pUVar3;
  UnicodeString local_1c0;
  UnicodeString local_180;
  undefined1 local_140 [8];
  UnicodeString negSuffixString;
  UnicodeString negPrefixString;
  undefined1 local_b0 [8];
  UnicodeString posSuffixString;
  UnicodeString posPrefixString;
  UErrorCode *status_local;
  parse_flags_t parseFlags_local;
  IgnorablesMatcher *ignorables_local;
  AffixPatternProvider *patternInfo_local;
  
  (*patternInfo->_vptr_AffixPatternProvider[4])
            ((undefined1 *)((long)&posSuffixString.fUnion + 0x30),patternInfo,0x100);
  (*patternInfo->_vptr_AffixPatternProvider[4])(local_b0,patternInfo,0);
  UnicodeString::UnicodeString((UnicodeString *)((long)&negSuffixString.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)local_140);
  uVar2 = (*patternInfo->_vptr_AffixPatternProvider[7])();
  if ((uVar2 & 1) != 0) {
    (*patternInfo->_vptr_AffixPatternProvider[4])(&local_180,patternInfo,0x300);
    UnicodeString::operator=((UnicodeString *)((long)&negSuffixString.fUnion + 0x30),&local_180);
    UnicodeString::~UnicodeString(&local_180);
    (*patternInfo->_vptr_AffixPatternProvider[4])(&local_1c0,patternInfo,0x200);
    UnicodeString::operator=((UnicodeString *)local_140,&local_1c0);
    UnicodeString::~UnicodeString(&local_1c0);
  }
  if ((parseFlags & 0x100U) == 0) {
    pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
    bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                      ((UnicodeString *)((long)&posSuffixString.fUnion + 0x30),pUVar3,status);
    if (bVar1) {
      pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
      bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                        ((UnicodeString *)local_b0,pUVar3,status);
      if (bVar1) {
        pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
        bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                          ((UnicodeString *)((long)&negSuffixString.fUnion + 0x30),pUVar3,status);
        if (bVar1) {
          pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
          bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                            ((UnicodeString *)local_140,pUVar3,status);
          if ((((bVar1) &&
               (bVar1 = icu_63::number::impl::AffixUtils::containsType
                                  ((UnicodeString *)local_b0,TYPE_PLUS_SIGN,status), !bVar1)) &&
              (bVar1 = icu_63::number::impl::AffixUtils::containsType
                                 ((UnicodeString *)local_b0,TYPE_MINUS_SIGN,status), !bVar1)) &&
             ((bVar1 = icu_63::number::impl::AffixUtils::containsType
                                 ((UnicodeString *)local_140,TYPE_PLUS_SIGN,status), !bVar1 &&
              (bVar1 = icu_63::number::impl::AffixUtils::containsType
                                 ((UnicodeString *)local_140,TYPE_MINUS_SIGN,status), !bVar1)))) {
            patternInfo_local._7_1_ = false;
            goto LAB_003240f3;
          }
        }
      }
    }
  }
  patternInfo_local._7_1_ = true;
LAB_003240f3:
  UnicodeString::~UnicodeString((UnicodeString *)local_140);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&negSuffixString.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)local_b0);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&posSuffixString.fUnion + 0x30));
  return patternInfo_local._7_1_;
}

Assistant:

bool AffixMatcherWarehouse::isInteresting(const AffixPatternProvider& patternInfo,
                                          const IgnorablesMatcher& ignorables, parse_flags_t parseFlags,
                                          UErrorCode& status) {
    UnicodeString posPrefixString = patternInfo.getString(AffixPatternProvider::AFFIX_POS_PREFIX);
    UnicodeString posSuffixString = patternInfo.getString(AffixPatternProvider::AFFIX_POS_SUFFIX);
    UnicodeString negPrefixString;
    UnicodeString negSuffixString;
    if (patternInfo.hasNegativeSubpattern()) {
        negPrefixString = patternInfo.getString(AffixPatternProvider::AFFIX_NEG_PREFIX);
        negSuffixString = patternInfo.getString(AffixPatternProvider::AFFIX_NEG_SUFFIX);
    }

    if (0 == (parseFlags & PARSE_FLAG_USE_FULL_AFFIXES) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(posPrefixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(posSuffixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(negPrefixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(negSuffixString, *ignorables.getSet(), status)
        // HACK: Plus and minus sign are a special case: we accept them trailing only if they are
        // trailing in the pattern string.
        && !AffixUtils::containsType(posSuffixString, TYPE_PLUS_SIGN, status) &&
        !AffixUtils::containsType(posSuffixString, TYPE_MINUS_SIGN, status) &&
        !AffixUtils::containsType(negSuffixString, TYPE_PLUS_SIGN, status) &&
        !AffixUtils::containsType(negSuffixString, TYPE_MINUS_SIGN, status)) {
        // The affixes contain only symbols and ignorables.
        // No need to generate affix matchers.
        return false;
    }
    return true;
}